

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeContextEvictImage
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_handle_t hImage)

{
  ze_pfnContextEvictImage_t pfnEvictImage;
  dditable_t *dditable;
  ze_result_t result;
  ze_image_handle_t hImage_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  if (*(code **)(*(long *)(hContext + 8) + 0x1d0) == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hContext_local._4_4_ =
         (**(code **)(*(long *)(hContext + 8) + 0x1d0))
                   (*(undefined8 *)hContext,*(undefined8 *)hDevice,*(undefined8 *)hImage);
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextEvictImage(
        ze_context_handle_t hContext,                   ///< [in] handle of context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_image_handle_t hImage                        ///< [in] handle of image to make evict
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnEvictImage = dditable->ze.Context.pfnEvictImage;
        if( nullptr == pfnEvictImage )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // convert loader handle to driver handle
        hImage = reinterpret_cast<ze_image_object_t*>( hImage )->handle;

        // forward to device-driver
        result = pfnEvictImage( hContext, hDevice, hImage );

        return result;
    }